

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.h
# Opt level: O1

bool __thiscall
cppcms::cache_interface::fetch_data<mydata>
          (cache_interface *this,string *key,mydata *data,bool notriggers)

{
  char cVar1;
  string buffer;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  cVar1 = cppcms::cache_interface::fetch((string *)this,(string *)key,SUB81(&local_38,0));
  if (cVar1 != '\0') {
    serialization_traits<mydata,_void>::load(&local_38,(serializable_base *)data);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (bool)cVar1;
}

Assistant:

bool fetch_data(std::string const &key,Serializable &data,bool notriggers=false)
		{
			std::string buffer;
			if(!fetch(key,buffer,notriggers))
				return false;
			serialization_traits<Serializable>::load(buffer,data);
			return true;
		}